

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shapes.h
# Opt level: O0

optional<pbrt::BilinearIntersection>
pbrt::IntersectBilinearPatch
          (Ray *ray,Float tMax,Point3f *p00,Point3f *p10,Point3f *p01,Point3f *p11)

{
  bool bVar1;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 uVar2;
  long in_RSI;
  optional<pbrt::BilinearIntersection> *in_RDI;
  float fVar3;
  float fVar4;
  float fVar5;
  undefined1 in_ZMM0 [64];
  undefined1 auVar23 [56];
  undefined1 auVar6 [64];
  undefined1 auVar7 [64];
  undefined1 auVar8 [64];
  undefined1 auVar9 [64];
  undefined1 auVar10 [64];
  undefined1 auVar11 [64];
  undefined1 auVar12 [64];
  undefined1 extraout_var [56];
  undefined1 auVar13 [64];
  undefined1 extraout_var_00 [56];
  undefined1 auVar14 [64];
  undefined1 auVar15 [64];
  undefined1 auVar16 [64];
  undefined1 auVar17 [64];
  undefined1 extraout_var_01 [56];
  undefined1 auVar18 [64];
  undefined1 auVar19 [64];
  undefined1 auVar20 [64];
  undefined1 auVar21 [64];
  undefined1 extraout_var_02 [56];
  undefined1 auVar22 [64];
  Vector3<float> VVar24;
  optional<pbrt::BilinearIntersection> oVar25;
  Float v2;
  Float t2;
  Float det_1;
  Vector3f n_1;
  Vector3f pb_1;
  Vector3f pa_1;
  Float v1;
  Float t1;
  Float det;
  Vector3f n;
  Vector3f pb;
  Vector3f pa;
  Float v;
  Float u;
  Float t;
  Float u2;
  Float u1;
  Float b;
  Float c;
  Float a;
  Vector3f q10;
  Vector3f q00;
  Vector3f e00;
  Vector3f e11;
  Vector3f qn;
  float in_stack_fffffffffffffd48;
  float in_stack_fffffffffffffd4c;
  aligned_storage_t<sizeof(pbrt::BilinearIntersection),_alignof(pbrt::BilinearIntersection)>
  *in_stack_fffffffffffffd50;
  Tuple3<pbrt::Point3,_float> *in_stack_fffffffffffffd58;
  optional<pbrt::BilinearIntersection> *poVar26;
  float in_stack_fffffffffffffd70;
  undefined4 in_stack_fffffffffffffda0;
  undefined4 in_stack_fffffffffffffda4;
  Tuple3<pbrt::Vector3,_float> *in_stack_fffffffffffffda8;
  Float in_stack_fffffffffffffdb4;
  aligned_storage_t<sizeof(pbrt::BilinearIntersection),_alignof(pbrt::BilinearIntersection)>
  local_248;
  Tuple3<pbrt::Vector3,_float> local_238;
  Tuple3<pbrt::Vector3,_float> local_228;
  undefined8 local_218;
  float local_210;
  undefined8 local_208;
  float local_200;
  float local_1f8;
  float local_1f4;
  Tuple3<pbrt::Point3,_float> local_1f0;
  Tuple3<pbrt::Point3,_float> local_1e0;
  float local_1d4;
  Tuple3<pbrt::Point3,_float> local_1d0;
  Tuple3<pbrt::Point3,_float> local_1c0;
  Tuple3<pbrt::Vector3,_float> local_1b0;
  Tuple3<pbrt::Vector3,_float> local_1a0;
  undefined8 local_190;
  float local_188;
  undefined8 local_180;
  float local_178;
  float local_174;
  float local_170;
  float local_16c;
  float local_168;
  float local_164;
  Tuple3<pbrt::Vector3,_float> local_160;
  Tuple3<pbrt::Vector3,_float> local_150;
  float local_144;
  Tuple3<pbrt::Vector3,_float> local_140;
  Tuple3<pbrt::Vector3,_float> local_130;
  float local_120;
  float local_11c;
  undefined8 local_118;
  float local_110;
  undefined8 local_108;
  float local_100;
  undefined8 local_f8;
  float local_f0;
  undefined8 local_e8;
  float local_e0;
  Tuple3<pbrt::Vector3,_float> local_d8;
  Tuple3<pbrt::Vector3,_float> local_c8;
  Tuple3<pbrt::Vector3,_float> local_b8;
  Tuple3<pbrt::Vector3,_float> local_a8;
  Tuple3<pbrt::Vector3,_float> local_98;
  undefined8 local_88;
  float local_80;
  undefined8 local_78;
  float local_70;
  undefined8 local_68;
  float local_60;
  undefined8 local_58;
  float local_50;
  Tuple3<pbrt::Vector3,_float> local_48 [4];
  float local_14;
  long local_10;
  
  auVar23 = in_ZMM0._8_56_;
  local_14 = in_ZMM0._0_4_;
  poVar26 = in_RDI;
  local_10 = in_RSI;
  VVar24 = Point3<float>::operator-
                     ((Point3<float> *)in_RDI,(Point3<float> *)in_stack_fffffffffffffd58);
  local_60 = VVar24.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar6._0_8_ = VVar24.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar6._8_56_ = auVar23;
  local_68 = vmovlpd_avx(auVar6._0_16_);
  local_58 = local_68;
  local_50 = local_60;
  VVar24 = Point3<float>::operator-
                     ((Point3<float> *)in_RDI,(Point3<float> *)in_stack_fffffffffffffd58);
  local_80 = VVar24.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar7._0_8_ = VVar24.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar7._8_56_ = auVar23;
  local_88 = vmovlpd_avx(auVar7._0_16_);
  local_78 = local_88;
  local_70 = local_80;
  VVar24 = Cross<float>((Vector3<float> *)in_RDI,(Vector3<float> *)in_stack_fffffffffffffd58);
  local_98.z = VVar24.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar8._0_8_ = VVar24.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar8._8_56_ = auVar23;
  local_98._0_8_ = vmovlpd_avx(auVar8._0_16_);
  local_48[0]._0_8_ = local_98._0_8_;
  local_48[0].z = local_98.z;
  VVar24 = Point3<float>::operator-
                     ((Point3<float> *)in_RDI,(Point3<float> *)in_stack_fffffffffffffd58);
  local_b8.z = VVar24.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar9._0_8_ = VVar24.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar9._8_56_ = auVar23;
  local_b8._0_8_ = vmovlpd_avx(auVar9._0_16_);
  local_a8._0_8_ = local_b8._0_8_;
  local_a8.z = local_b8.z;
  VVar24 = Point3<float>::operator-
                     ((Point3<float> *)in_RDI,(Point3<float> *)in_stack_fffffffffffffd58);
  local_d8.z = VVar24.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar10._0_8_ = VVar24.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar10._8_56_ = auVar23;
  local_d8._0_8_ = vmovlpd_avx(auVar10._0_16_);
  local_c8._0_8_ = local_d8._0_8_;
  local_c8.z = local_d8.z;
  VVar24 = Point3<float>::operator-
                     ((Point3<float> *)in_RDI,(Point3<float> *)in_stack_fffffffffffffd58);
  local_f0 = VVar24.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar11._0_8_ = VVar24.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar11._8_56_ = auVar23;
  local_f8 = vmovlpd_avx(auVar11._0_16_);
  local_e8 = local_f8;
  local_e0 = local_f0;
  VVar24 = Point3<float>::operator-
                     ((Point3<float> *)in_RDI,(Point3<float> *)in_stack_fffffffffffffd58);
  local_110 = VVar24.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar12._0_8_ = VVar24.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar12._8_56_ = auVar23;
  local_118 = vmovlpd_avx(auVar12._0_16_);
  local_108 = local_118;
  local_100 = local_110;
  local_11c = Dot<float>((Vector3<float> *)local_48,(Vector3<float> *)(local_10 + 0xc));
  auVar23 = extraout_var;
  VVar24 = Cross<float>((Vector3<float> *)in_RDI,(Vector3<float> *)in_stack_fffffffffffffd58);
  local_140.z = VVar24.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar13._0_8_ = VVar24.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar13._8_56_ = auVar23;
  local_140._0_8_ = vmovlpd_avx(auVar13._0_16_);
  local_130._0_8_ = local_140._0_8_;
  local_130.z = local_140.z;
  local_120 = Dot<float>((Vector3<float> *)&local_130,(Vector3<float> *)&local_c8);
  auVar23 = extraout_var_00;
  VVar24 = Cross<float>((Vector3<float> *)in_RDI,(Vector3<float> *)in_stack_fffffffffffffd58);
  local_160.z = VVar24.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar14._0_8_ = VVar24.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar14._8_56_ = auVar23;
  local_160._0_8_ = vmovlpd_avx(auVar14._0_16_);
  local_150._0_8_ = local_160._0_8_;
  local_150.z = local_160.z;
  local_144 = Dot<float>((Vector3<float> *)&local_150,(Vector3<float> *)&local_a8);
  local_144 = local_144 - (local_11c + local_120);
  bVar1 = Quadratic(in_stack_fffffffffffffd70,(float)((ulong)poVar26 >> 0x20),SUB84(poVar26,0),
                    (float *)in_RDI,&in_stack_fffffffffffffd58->x);
  if (bVar1) {
    local_16c = local_14;
    if ((0.0 <= local_164) && (local_164 <= 1.0)) {
      auVar23 = (undefined1  [56])0x0;
      VVar24 = Lerp<pbrt::Vector3,float>
                         (in_stack_fffffffffffffdb4,in_stack_fffffffffffffda8,
                          (Tuple3<pbrt::Vector3,_float> *)
                          CONCAT44(in_stack_fffffffffffffda4,in_stack_fffffffffffffda0));
      local_188 = VVar24.super_Tuple3<pbrt::Vector3,_float>.z;
      auVar15._0_8_ = VVar24.super_Tuple3<pbrt::Vector3,_float>._0_8_;
      auVar15._8_56_ = auVar23;
      local_190 = vmovlpd_avx(auVar15._0_16_);
      auVar23 = (undefined1  [56])0x0;
      local_180 = local_190;
      local_178 = local_188;
      VVar24 = Lerp<pbrt::Vector3,float>
                         (in_stack_fffffffffffffdb4,in_stack_fffffffffffffda8,
                          (Tuple3<pbrt::Vector3,_float> *)
                          CONCAT44(in_stack_fffffffffffffda4,in_stack_fffffffffffffda0));
      local_1b0.z = VVar24.super_Tuple3<pbrt::Vector3,_float>.z;
      auVar16._0_8_ = VVar24.super_Tuple3<pbrt::Vector3,_float>._0_8_;
      auVar16._8_56_ = auVar23;
      local_1b0._0_8_ = vmovlpd_avx(auVar16._0_16_);
      local_1a0._0_8_ = local_1b0._0_8_;
      local_1a0.z = local_1b0.z;
      VVar24 = Cross<float>((Vector3<float> *)in_RDI,(Vector3<float> *)in_stack_fffffffffffffd58);
      local_1d0.z = VVar24.super_Tuple3<pbrt::Vector3,_float>.z;
      auVar17._0_8_ = VVar24.super_Tuple3<pbrt::Vector3,_float>._0_8_;
      auVar17._8_56_ = auVar23;
      local_1d0._0_8_ = vmovlpd_avx(auVar17._0_16_);
      in_stack_fffffffffffffd58 = &local_1c0;
      local_1c0._0_8_ = local_1d0._0_8_;
      local_1c0.z = local_1d0.z;
      local_1d4 = Dot<float>((Vector3<float> *)in_stack_fffffffffffffd58,
                             (Vector3<float> *)in_stack_fffffffffffffd58);
      auVar23 = extraout_var_01;
      VVar24 = Cross<float>((Vector3<float> *)in_RDI,(Vector3<float> *)in_stack_fffffffffffffd58);
      local_1f0.z = VVar24.super_Tuple3<pbrt::Vector3,_float>.z;
      auVar18._0_8_ = VVar24.super_Tuple3<pbrt::Vector3,_float>._0_8_;
      auVar18._8_56_ = auVar23;
      local_1f0._0_8_ = vmovlpd_avx(auVar18._0_16_);
      local_1e0._0_8_ = local_1f0._0_8_;
      local_1e0.z = local_1f0.z;
      local_1c0._0_8_ = local_1f0._0_8_;
      local_1c0.z = local_1f0.z;
      local_1f4 = Dot<float>((Vector3<float> *)&local_1c0,(Vector3<float> *)&local_1a0);
      local_1f8 = Dot<float>((Vector3<float> *)&local_1c0,(Vector3<float> *)(local_10 + 0xc));
      if ((0.0 < local_1f4) && ((0.0 <= local_1f8 && (local_1f8 <= local_1d4)))) {
        local_170 = local_164;
        local_174 = local_1f8 / local_1d4;
        local_16c = local_1f4 / local_1d4;
      }
    }
    if (((0.0 <= local_168) && (local_168 <= 1.0)) &&
       ((local_168 != local_164 || (NAN(local_168) || NAN(local_164))))) {
      auVar23 = (undefined1  [56])0x0;
      VVar24 = Lerp<pbrt::Vector3,float>
                         (in_stack_fffffffffffffdb4,in_stack_fffffffffffffda8,
                          (Tuple3<pbrt::Vector3,_float> *)
                          CONCAT44(in_stack_fffffffffffffda4,in_stack_fffffffffffffda0));
      local_210 = VVar24.super_Tuple3<pbrt::Vector3,_float>.z;
      auVar19._0_8_ = VVar24.super_Tuple3<pbrt::Vector3,_float>._0_8_;
      auVar19._8_56_ = auVar23;
      local_218 = vmovlpd_avx(auVar19._0_16_);
      auVar23 = (undefined1  [56])0x0;
      local_208 = local_218;
      local_200 = local_210;
      VVar24 = Lerp<pbrt::Vector3,float>
                         (in_stack_fffffffffffffdb4,in_stack_fffffffffffffda8,
                          (Tuple3<pbrt::Vector3,_float> *)
                          CONCAT44(in_stack_fffffffffffffda4,in_stack_fffffffffffffda0));
      local_238.z = VVar24.super_Tuple3<pbrt::Vector3,_float>.z;
      auVar20._0_8_ = VVar24.super_Tuple3<pbrt::Vector3,_float>._0_8_;
      auVar20._8_56_ = auVar23;
      local_238._0_8_ = vmovlpd_avx(auVar20._0_16_);
      local_228._0_8_ = local_238._0_8_;
      local_228.z = local_238.z;
      VVar24 = Cross<float>((Vector3<float> *)in_RDI,(Vector3<float> *)in_stack_fffffffffffffd58);
      local_248._8_4_ = VVar24.super_Tuple3<pbrt::Vector3,_float>.z;
      auVar21._0_8_ = VVar24.super_Tuple3<pbrt::Vector3,_float>._0_8_;
      auVar21._8_56_ = auVar23;
      local_248._0_8_ = vmovlpd_avx(auVar21._0_16_);
      in_stack_fffffffffffffd50 = &local_248;
      fVar3 = Dot<float>((Vector3<float> *)&in_stack_fffffffffffffd50->__align,
                         (Vector3<float> *)in_stack_fffffffffffffd50);
      auVar23 = extraout_var_02;
      VVar24 = Cross<float>((Vector3<float> *)in_RDI,(Vector3<float> *)in_stack_fffffffffffffd58);
      local_248._8_4_ = VVar24.super_Tuple3<pbrt::Vector3,_float>.z;
      auVar22._0_8_ = VVar24.super_Tuple3<pbrt::Vector3,_float>._0_8_;
      auVar22._8_56_ = auVar23;
      local_248._0_8_ = vmovlpd_avx(auVar22._0_16_);
      fVar4 = Dot<float>((Vector3<float> *)&local_248.__align,(Vector3<float> *)&local_228);
      fVar4 = fVar4 / fVar3;
      fVar5 = Dot<float>((Vector3<float> *)&local_248.__align,(Vector3<float> *)(local_10 + 0xc));
      if ((((0.0 <= fVar5) && (fVar5 <= fVar3)) && (fVar4 < local_16c)) && (0.0 < fVar4)) {
        local_170 = local_168;
        local_174 = fVar5 / fVar3;
        local_16c = fVar4;
      }
    }
    if (local_16c < local_14) {
      Point2<float>::Point2
                ((Point2<float> *)&in_stack_fffffffffffffd50->__align,in_stack_fffffffffffffd4c,
                 in_stack_fffffffffffffd48);
      pstd::optional<pbrt::BilinearIntersection>::optional
                ((optional<pbrt::BilinearIntersection> *)&in_stack_fffffffffffffd50->__align,
                 (BilinearIntersection *)
                 CONCAT44(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48));
      uVar2 = extraout_RDX_01;
    }
    else {
      memset(in_RDI,0,0x10);
      pstd::optional<pbrt::BilinearIntersection>::optional(in_RDI);
      uVar2 = extraout_RDX_00;
    }
  }
  else {
    memset(in_RDI,0,0x10);
    pstd::optional<pbrt::BilinearIntersection>::optional(in_RDI);
    uVar2 = extraout_RDX;
  }
  oVar25._8_8_ = uVar2;
  oVar25.optionalValue._0_8_ = poVar26;
  return oVar25;
}

Assistant:

PBRT_CPU_GPU inline pstd::optional<BilinearIntersection> IntersectBilinearPatch(
    const Ray &ray, Float tMax, const Point3f &p00, const Point3f &p10,
    const Point3f &p01, const Point3f &p11) {
    // Find quadratic coefficients for distance from ray to $u$ line
    Vector3f qn = Cross(p10 - p00, p01 - p11);
    Vector3f e11 = p11 - p10, e00 = p01 - p00;
    Vector3f q00 = p00 - ray.o, q10 = p10 - ray.o;
    Float a = Dot(qn, ray.d);
    Float c = Dot(Cross(q00, ray.d), e00);
    Float b = Dot(Cross(q10, ray.d), e11) - (a + c);

    // Solve quadratic for bilinear patch intersection
    Float u1, u2;
    if (!Quadratic(a, b, c, &u1, &u2))
        return {};

    Float t = tMax, u, v;
    // Compute $(u,v)$ and ray $t$ corresponding to first quadratic root
    if (0 <= u1 && u1 <= 1) {
        Vector3f pa = Lerp(u1, q00, q10), pb = Lerp(u1, e00, e11);
        Vector3f n = Cross(ray.d, pb);
        Float det = Dot(n, n);
        n = Cross(n, pa);
        Float t1 = Dot(n, pb), v1 = Dot(n, ray.d);
        // Set _u_, _v_, and _t_ if intersection is valid
        if (t1 > 0 && 0 <= v1 && v1 <= det) {
            u = u1;
            v = v1 / det;
            t = t1 / det;
        }
    }

    // Compute $(u,v)$ and ray $t$ corresponding to second quadratic root
    if (0 <= u2 && u2 <= 1 && u2 != u1) {
        Vector3f pa = Lerp(u2, q00, q10), pb = Lerp(u2, e00, e11);
        Vector3f n = Cross(ray.d, pb);
        Float det = Dot(n, n);
        n = Cross(n, pa);
        Float t2 = Dot(n, pb) / det;
        Float v2 = Dot(n, ray.d);
        if (0 <= v2 && v2 <= det && t > t2 && t2 > 0) {
            t = t2;
            u = u2;
            v = v2 / det;
        }
    }

    // TODO: reject hits with sufficiently small t that we're not sure.
    // Check intersection $t$ against _tMax_ and possibly return intersection
    if (t >= tMax)
        return {};
    return BilinearIntersection{{u, v}, t};
}